

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O3

shared_ptr<adios2::core::Engine> __thiscall
adios2::core::IO::MakeEngine<adios2::core::engine::SstReader>
          (IO *this,IO *io,string *name,Mode mode,Comm *comm)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<adios2::core::Engine> sVar1;
  undefined1 local_2d;
  Mode local_2c;
  ADIOS *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_28 = (ADIOS *)0x0;
  local_2c = mode;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<adios2::core::engine::SstReader,std::allocator<adios2::core::engine::SstReader>,adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode_const&,adios2::helper::Comm>
            (a_Stack_20,(SstReader **)&local_28,
             (allocator<adios2::core::engine::SstReader> *)&local_2d,io,name,&local_2c,comm);
  this->m_ADIOS = local_28;
  (this->m_Gr).super___shared_ptr<adios2::core::Group,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)a_Stack_20[0]._M_pi;
  sVar1.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<adios2::core::Engine>)
         sVar1.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<Engine> MakeEngine(IO &io, const std::string &name, const Mode mode,
                                              helper::Comm comm)
    {
        return std::make_shared<T>(io, name, mode, std::move(comm));
    }